

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elempatch.c
# Opt level: O2

void nga_vfill_patch(Integer *g_a,Integer *lo,Integer *hi)

{
  Integer proc;
  logical lVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  void *data_ptr;
  int local_204;
  Integer ndim;
  Integer hiA [7];
  Integer loA [7];
  long local_178 [8];
  Integer *local_138;
  Integer type;
  Integer baseld [7];
  Integer bunit [7];
  Integer ld [7];
  Integer dims [7];
  
  local_138 = hi;
  proc = pnga_nodeid();
  bVar9 = _ga_sync_begin != 0;
  local_204 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar9) {
    GA_Sync();
  }
  pnga_inquire(*g_a,&type,&ndim,dims);
  pnga_distribution(*g_a,proc,loA,hiA);
  lVar1 = pnga_patch_intersect(lo,local_138,loA,hiA,ndim);
  if (lVar1 != 0) {
    pnga_access_ptr(*g_a,loA,hiA,&data_ptr,ld);
    lVar2 = 1;
    lVar6 = lVar2;
    for (; lVar2 < ndim; lVar2 = lVar2 + 1) {
      lVar6 = lVar6 * ((hiA[lVar2] - loA[lVar2]) + 1);
    }
    local_178[0] = 0;
    local_178[1] = 0;
    bunit[0] = 1;
    bunit[1] = 1;
    baseld[0] = ld[0];
    baseld[1] = ld[0] * ld[1];
    for (lVar2 = 2; lVar2 < ndim; lVar2 = lVar2 + 1) {
      local_178[lVar2] = 0;
      bunit[lVar2] = ((hiA[lVar2 + -1] - loA[lVar2 + -1]) + 1) * bunit[lVar2 + -1];
      baseld[lVar2] = ld[lVar2] * baseld[lVar2 + -1];
    }
    switch(type) {
    case 0x3e9:
      lVar2 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar2;
      }
      while (lVar2 != lVar6) {
        lVar2 = lVar2 + 1;
        lVar7 = 0;
        for (lVar8 = 1; lVar8 < ndim; lVar8 = lVar8 + 1) {
          lVar7 = lVar7 + baseld[lVar8 + -1] * local_178[lVar8];
          lVar5 = local_178[lVar8] + (ulong)(lVar2 % bunit[lVar8] == 0);
          lVar4 = 0;
          if (lVar5 <= hiA[lVar8] - loA[lVar8]) {
            lVar4 = lVar5;
          }
          local_178[lVar8] = lVar4;
        }
        for (lVar8 = 0; lVar8 <= hiA[0] - loA[0]; lVar8 = lVar8 + 1) {
          *(int *)((long)data_ptr + lVar8 * 4 + lVar7 * 4) = (int)lVar7 + (int)lVar8;
        }
      }
      break;
    case 0x3ea:
      lVar2 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar2;
      }
      while (lVar2 != lVar6) {
        lVar2 = lVar2 + 1;
        lVar7 = 0;
        for (lVar8 = 1; lVar8 < ndim; lVar8 = lVar8 + 1) {
          lVar7 = lVar7 + baseld[lVar8 + -1] * local_178[lVar8];
          lVar5 = local_178[lVar8] + (ulong)(lVar2 % bunit[lVar8] == 0);
          lVar4 = 0;
          if (lVar5 <= hiA[lVar8] - loA[lVar8]) {
            lVar4 = lVar5;
          }
          local_178[lVar8] = lVar4;
        }
        for (lVar8 = 0; lVar8 <= hiA[0] - loA[0]; lVar8 = lVar8 + 1) {
          *(long *)((long)data_ptr + lVar8 * 8 + lVar7 * 8) = lVar7 + lVar8;
        }
      }
      break;
    case 0x3eb:
      lVar2 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar2;
      }
      while (lVar2 != lVar6) {
        lVar2 = lVar2 + 1;
        lVar7 = 0;
        for (lVar8 = 1; lVar8 < ndim; lVar8 = lVar8 + 1) {
          lVar7 = lVar7 + baseld[lVar8 + -1] * local_178[lVar8];
          lVar5 = local_178[lVar8] + (ulong)(lVar2 % bunit[lVar8] == 0);
          lVar4 = 0;
          if (lVar5 <= hiA[lVar8] - loA[lVar8]) {
            lVar4 = lVar5;
          }
          local_178[lVar8] = lVar4;
        }
        for (lVar8 = 0; lVar8 <= hiA[0] - loA[0]; lVar8 = lVar8 + 1) {
          *(float *)((long)data_ptr + lVar8 * 4 + lVar7 * 4) = (float)(lVar7 + lVar8);
        }
      }
      break;
    case 0x3ec:
      lVar2 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar2;
      }
      while (lVar2 != lVar6) {
        lVar2 = lVar2 + 1;
        lVar7 = 0;
        for (lVar8 = 1; lVar8 < ndim; lVar8 = lVar8 + 1) {
          lVar7 = lVar7 + baseld[lVar8 + -1] * local_178[lVar8];
          lVar5 = local_178[lVar8] + (ulong)(lVar2 % bunit[lVar8] == 0);
          lVar4 = 0;
          if (lVar5 <= hiA[lVar8] - loA[lVar8]) {
            lVar4 = lVar5;
          }
          local_178[lVar8] = lVar4;
        }
        for (lVar8 = 0; lVar8 <= hiA[0] - loA[0]; lVar8 = lVar8 + 1) {
          *(double *)((long)data_ptr + lVar8 * 8 + lVar7 * 8) = (double)(lVar7 + lVar8);
        }
      }
      break;
    default:
      GA_Error(" wrong data type ",(int)type);
      break;
    case 0x3ee:
      lVar2 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar2;
      }
      while (lVar2 != lVar6) {
        lVar2 = lVar2 + 1;
        lVar7 = 0;
        for (lVar8 = 1; lVar8 < ndim; lVar8 = lVar8 + 1) {
          lVar7 = lVar7 + baseld[lVar8 + -1] * local_178[lVar8];
          lVar5 = local_178[lVar8] + (ulong)(lVar2 % bunit[lVar8] == 0);
          lVar4 = 0;
          if (lVar5 <= hiA[lVar8] - loA[lVar8]) {
            lVar4 = lVar5;
          }
          local_178[lVar8] = lVar4;
        }
        for (lVar8 = 0; lVar8 <= hiA[0] - loA[0]; lVar8 = lVar8 + 1) {
          *(float *)((long)data_ptr + lVar8 * 8 + lVar7 * 8) = (float)(lVar7 + lVar8);
          *(float *)((long)data_ptr + lVar8 * 8 + lVar7 * 8 + 4) = (float)(lVar7 + lVar8);
        }
      }
      break;
    case 0x3ef:
      lVar2 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar2;
      }
      while (lVar2 != lVar6) {
        lVar2 = lVar2 + 1;
        lVar7 = 0;
        for (lVar8 = 1; lVar8 < ndim; lVar8 = lVar8 + 1) {
          lVar7 = lVar7 + baseld[lVar8 + -1] * local_178[lVar8];
          lVar5 = local_178[lVar8] + (ulong)(lVar2 % bunit[lVar8] == 0);
          lVar4 = 0;
          if (lVar5 <= hiA[lVar8] - loA[lVar8]) {
            lVar4 = lVar5;
          }
          local_178[lVar8] = lVar4;
        }
        pdVar3 = (double *)((long)data_ptr + lVar7 * 0x10 + 8);
        for (lVar8 = 0; lVar8 <= hiA[0] - loA[0]; lVar8 = lVar8 + 1) {
          pdVar3[-1] = (double)(lVar7 + lVar8);
          *pdVar3 = (double)(lVar7 + lVar8);
          pdVar3 = pdVar3 + 2;
        }
      }
    }
    pnga_release_update(*g_a,loA,hiA);
  }
  if (local_204 != 0) {
    GA_Sync();
  }
  return;
}

Assistant:

void nga_vfill_patch(Integer *g_a, Integer *lo, Integer *hi)
{
  Integer i, j;
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  void *data_ptr;
  Integer idx, n1dim;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseld[MAXDIM];
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)GA_Sync(); 

  pnga_inquire(*g_a,  &type, &ndim, dims);

  /* get limits of VISIBLE patch */ 
  pnga_distribution(*g_a, me, loA, hiA);

  /*  determine subset of my local patch to access  */
  /*  Output is in loA and hiA */
  if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

    /* get data_ptr to corner of patch */
    /* ld are leading dimensions INCLUDING ghost cells */
    pnga_access_ptr(*g_a, loA, hiA, &data_ptr, ld);

    /* number of n-element of the first dimension */
    n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiA[i] - loA[i] + 1);

    /* calculate the destination indices */
    bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
    /* baseld[0] = ld[0]
     * baseld[1] = ld[0] * ld[1]
     * baseld[2] = ld[0] * ld[1] * ld[2] .....
     */
    baseld[0] = ld[0]; baseld[1] = baseld[0] *ld[1];
    for(i=2; i<ndim; i++) {
      bvalue[i] = 0;
      bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
      baseld[i] = baseld[i-1] * ld[i];
    }

    switch (type){
      case C_INT:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((int *)data_ptr)[idx+j] = (int)(idx+j);
        }
        break;
      case C_DCPL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) {
            ((DoubleComplex *)data_ptr)[idx+j].real = (double)(idx+j);
            ((DoubleComplex *)data_ptr)[idx+j].imag = (double)(idx+j);
          }
        }

        break;
      case C_SCPL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) {
            ((SingleComplex *)data_ptr)[idx+j].real = (float)(idx+j);
            ((SingleComplex *)data_ptr)[idx+j].imag = (float)(idx+j);
          }
        }

        break;
      case C_DBL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) 
            ((double*)data_ptr)[idx+j] = (double)(idx+j);
        }
        break;
      case C_FLOAT:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((float *)data_ptr)[idx+j] = (float)(idx+j);
        }
        break;     
      case C_LONG:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((long *)data_ptr)[idx+j] = (long)(idx+j);
        } 
        break;                          
      default: GA_Error(" wrong data type ",type);
    }

    /* release access to the data */
    pnga_release_update(*g_a, loA, hiA);
  }
  if(local_sync_end)GA_Sync();
}